

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall FIX::Exception::Exception(Exception *this,string *type,string *detail)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  sVar1 = detail->_M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::string((string *)&bStack_68,(string *)type);
  }
  else {
    std::operator+(&local_48,type,": ");
    std::operator+(&bStack_68,&local_48,detail);
  }
  std::logic_error::logic_error(&this->super_logic_error,(string *)&bStack_68);
  std::__cxx11::string::~string((string *)&bStack_68);
  if (sVar1 != 0) {
    std::__cxx11::string::~string((string *)&local_48);
  }
  *(undefined ***)this = &PTR__Exception_0014fad0;
  std::__cxx11::string::string((string *)&this->type,(string *)type);
  std::__cxx11::string::string((string *)&this->detail,(string *)detail);
  return;
}

Assistant:

Exception(const std::string &type, const std::string &detail)
      : std::logic_error(detail.size() ? type + ": " + detail : type),
        type(type),
        detail(detail) {}